

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicOperatorType.cpp
# Opt level: O1

LogicOperatorType IRT::Reverse(LogicOperatorType type)

{
  return (LogicOperatorType)(0x50401000302 >> (type * '\b' & 0x3f));
}

Assistant:

IRT::LogicOperatorType IRT::Reverse(LogicOperatorType type) {
  switch (type) {
    case LogicOperatorType::EQ:
      return LogicOperatorType::EQ;
    case LogicOperatorType::NE:
      return LogicOperatorType::NE;
    case LogicOperatorType::LT:
      return LogicOperatorType::GT;
    case LogicOperatorType::GT:
      return LogicOperatorType::LT;
    case LogicOperatorType::LE:
      return LogicOperatorType::GE;
    case LogicOperatorType::GE:
      return LogicOperatorType::LE;
  }
}